

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.cxx
# Opt level: O0

void __thiscall
cmTargetPropCommandBase::HandleInterfaceContent
          (cmTargetPropCommandBase *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool param_4)

{
  bool bVar1;
  string *__rhs;
  optional<cmListFileBacktrace> local_140;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  string totalContent;
  cmValue propValue;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string propName;
  bool param_4_local;
  bool prepend_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *content_local;
  cmTarget *tgt_local;
  cmTargetPropCommandBase *this_local;
  
  propName.field_2._M_local_buf[0xe] = param_4;
  propName.field_2._M_local_buf[0xf] = prepend;
  if (prepend) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"INTERFACE_",&local_69);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   &local_68,&this->Property);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    totalContent.field_2._8_8_ = cmTarget::GetProperty(tgt,(string *)local_48);
    (*this->_vptr_cmTargetPropCommandBase[6])(&local_c8,this,content);
    bVar1 = cmValue::operator_cast_to_bool((cmValue *)((long)&totalContent.field_2 + 8));
    if (bVar1) {
      __rhs = cmValue::operator*[abi_cxx11_((cmValue *)((long)&totalContent.field_2 + 8));
      std::operator+(&local_e8,";",__rhs);
    }
    else {
      std::__cxx11::string::string((string *)&local_e8);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   &local_c8,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    cmTarget::SetProperty(tgt,(string *)local_48,(string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    std::operator+(&local_108,"INTERFACE_",&this->Property);
    (*this->_vptr_cmTargetPropCommandBase[6])(&local_128,this,content);
    std::optional<cmListFileBacktrace>::optional();
    cmTarget::AppendProperty(tgt,&local_108,&local_128,&local_140,false);
    std::optional<cmListFileBacktrace>::~optional(&local_140);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_108);
  }
  return;
}

Assistant:

void cmTargetPropCommandBase::HandleInterfaceContent(
  cmTarget* tgt, const std::vector<std::string>& content, bool prepend, bool)
{
  if (prepend) {
    const std::string propName = std::string("INTERFACE_") + this->Property;
    cmValue propValue = tgt->GetProperty(propName);
    const std::string totalContent =
      this->Join(content) + (propValue ? (";" + *propValue) : std::string());
    tgt->SetProperty(propName, totalContent);
  } else {
    tgt->AppendProperty("INTERFACE_" + this->Property, this->Join(content));
  }
}